

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O0

int __thiscall
CVmObjVector::getp_splice(CVmObjVector *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  int iVar2;
  vm_obj_id_t self_00;
  size_t sVar3;
  vm_val_t *idx;
  int *in_RCX;
  vm_val_t *in_RDX;
  vm_obj_id_t in_ESI;
  CVmObjVector *in_RDI;
  int i;
  int ins_cnt;
  vm_val_t *ins;
  int del_cnt;
  int start_idx;
  int old_cnt;
  uint argc;
  undefined4 in_stack_ffffffffffffff98;
  int iVar4;
  undefined4 in_stack_ffffffffffffffa8;
  int iVar5;
  undefined4 in_stack_ffffffffffffffac;
  int local_48;
  int in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffc8;
  vm_obj_id_t in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  vm_obj_id_t self_01;
  
  if (in_RCX == (int *)0x0) {
    iVar4 = 0;
  }
  else {
    iVar4 = *in_RCX;
  }
  iVar5 = iVar4;
  if ((getp_splice(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_splice(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_splice::desc,2,0,1);
    __cxa_guard_release(&getp_splice(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  self_01 = (vm_obj_id_t)((ulong)in_RCX >> 0x20);
  iVar1 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                     (uint *)in_RDI,(CVmNativeCodeDesc *)CONCAT44(iVar4,in_stack_ffffffffffffff98));
  if (iVar1 == 0) {
    sVar3 = get_element_count((CVmObjVector *)0x34d2c7);
    iVar1 = (int)sVar3;
    iVar2 = CVmBif::pop_int_val();
    if (iVar2 < 1) {
      iVar2 = iVar1 + 1 + iVar2;
    }
    self_00 = iVar2 - 1;
    if (((int)self_00 < 0) || (iVar1 < (int)self_00)) {
      err_throw(0);
    }
    local_48 = CVmBif::pop_int_val();
    if ((int)(iVar1 - self_00) < local_48) {
      local_48 = iVar1 - self_00;
    }
    idx = CVmStack::get(0);
    iVar2 = iVar5 + -2;
    vm_val_t::set_obj(in_RDX,in_ESI);
    CVmStack::push(in_RDX);
    if (iVar2 < local_48) {
      remove_elements_undo
                ((CVmObjVector *)in_RDX,self_01,CONCAT44(iVar5,in_stack_ffffffffffffffd0),
                 CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    }
    else if (local_48 < iVar2) {
      insert_elements_undo
                ((CVmObjVector *)CONCAT44(iVar5,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc
                 ,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
    }
    for (iVar5 = 0; iVar5 < iVar2; iVar5 = iVar5 + 1) {
      if (iVar5 < iVar1) {
        set_element_undo((CVmObjVector *)CONCAT44(in_stack_ffffffffffffffc4,iVar1),self_00,
                         (size_t)idx,(vm_val_t *)CONCAT44(iVar2,iVar5));
      }
      else {
        set_element(in_RDI,CONCAT44(iVar4,in_stack_ffffffffffffff98),(vm_val_t *)0x34d416);
      }
      idx = idx + -1;
    }
    CVmStack::discard(iVar2 + 1);
  }
  return 1;
}

Assistant:

int CVmObjVector::getp_splice(VMG_ vm_obj_id_t self, vm_val_t *retval,
                              uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(2, 0, TRUE);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the current vector size */
    int old_cnt = get_element_count();

    /* get the starting index, and adjust a zero or negative index */
    int start_idx = CVmBif::pop_int_val(vmg0_);
    if (start_idx <= 0)
        start_idx += old_cnt + 1;

    /* adjust to a zero-based starting index */
    --start_idx;

    /* make sure the starting index is in range */
    if (start_idx < 0 || start_idx > old_cnt)
        err_throw(VMERR_INDEX_OUT_OF_RANGE);;

    /* get the deletion count */
    int del_cnt = CVmBif::pop_int_val(vmg0_);

    /* adjust the deletion count to the number of elements remaining */
    if (del_cnt > old_cnt - start_idx)
        del_cnt = old_cnt - start_idx;

    /* get a pointer to the first inserted item, and the number of items */
    vm_val_t *ins = G_stk->get(0);
    int ins_cnt = argc - 2;

    /* the result object is 'self'; push self for gc protection */
    retval->set_obj(self);
    G_stk->push(retval);

    /* 
     *   If we're doing a net deletion, contract the vector.  If we're doing
     *   a net expansion, expand it. 
     */
    if (del_cnt > ins_cnt)
    {
        /* net deletion - remove the excess of deletions over insertions */
        remove_elements_undo(
            vmg_ self, start_idx + ins_cnt, del_cnt - ins_cnt);
    }
    else if (del_cnt < ins_cnt)
    {
        /* net insertion - add room for the excess inserted items */
        insert_elements_undo(
            vmg_ self, start_idx + del_cnt, ins_cnt - del_cnt);
    }

    /* set the new elements */
    for (int i = 0 ; i < ins_cnt ; ++i, --ins)
    {
        /* 
         *   If this element is within the old vector's size range, save
         *   undo, since we're overwriting a pre-existing element.  If it's
         *   beyond the end of the old vector, there's no need to keep undo
         *   since the overall undo operation will simply shrink the vector
         *   to eliminate the slot. 
         */
        if (i < old_cnt)
            set_element_undo(vmg_ self, start_idx + i, ins);
        else
            set_element(start_idx + i, ins);
    }

    /* discard the arguments and gc protection */
    G_stk->discard(ins_cnt + 1);

    /* handled */
    return TRUE;
}